

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_UpdateMonitors(void)

{
  float local_88;
  float local_84;
  float y_scale;
  float x_scale;
  ImVec2 local_78;
  int local_70;
  int local_6c;
  int h;
  int w;
  ImVec2 local_60;
  GLFWvidmode *local_58;
  GLFWvidmode *vid_mode;
  int y;
  int x;
  ImGuiPlatformMonitor monitor;
  int n;
  GLFWmonitor **glfw_monitors;
  ImGuiPlatformIO *pIStack_10;
  int monitors_count;
  ImGuiPlatformIO *platform_io;
  
  pIStack_10 = ImGui::GetPlatformIO();
  glfw_monitors._4_4_ = 0;
  register0x00000000 = glfwGetMonitors((int *)((long)&glfw_monitors + 4));
  ImVector<ImGuiPlatformMonitor>::resize(&pIStack_10->Monitors,0);
  for (monitor.WorkSize.y = 0.0; (int)monitor.WorkSize.y < glfw_monitors._4_4_;
      monitor.WorkSize.y = (float)((int)monitor.WorkSize.y + 1)) {
    ImGuiPlatformMonitor::ImGuiPlatformMonitor((ImGuiPlatformMonitor *)&y);
    glfwGetMonitorPos(stack0xffffffffffffffe0[(int)monitor.WorkSize.y],(int *)((long)&vid_mode + 4),
                      (int *)&vid_mode);
    local_58 = glfwGetVideoMode(stack0xffffffffffffffe0[(int)monitor.WorkSize.y]);
    ImVec2::ImVec2(&local_60,(float)vid_mode._4_4_,(float)(int)vid_mode);
    _y = local_60;
    ImVec2::ImVec2((ImVec2 *)&h,(float)local_58->width,(float)local_58->height);
    monitor.MainPos = _h;
    glfwGetMonitorWorkarea
              (stack0xffffffffffffffe0[(int)monitor.WorkSize.y],(int *)((long)&vid_mode + 4),
               (int *)&vid_mode,&local_6c,&local_70);
    ImVec2::ImVec2(&local_78,(float)vid_mode._4_4_,(float)(int)vid_mode);
    monitor.MainSize = local_78;
    ImVec2::ImVec2((ImVec2 *)&y_scale,(float)local_6c,(float)local_70);
    monitor.WorkPos = _y_scale;
    glfwGetMonitorContentScale(stack0xffffffffffffffe0[(int)monitor.WorkSize.y],&local_84,&local_88)
    ;
    monitor.WorkSize.x = local_84;
    ImVector<ImGuiPlatformMonitor>::push_back(&pIStack_10->Monitors,(ImGuiPlatformMonitor *)&y);
  }
  g_WantUpdateMonitors = false;
  return;
}

Assistant:

static void ImGui_ImplGlfw_UpdateMonitors()
{
    ImGuiPlatformIO& platform_io = ImGui::GetPlatformIO();
    int monitors_count = 0;
    GLFWmonitor** glfw_monitors = glfwGetMonitors(&monitors_count);
    platform_io.Monitors.resize(0);
    for (int n = 0; n < monitors_count; n++)
    {
        ImGuiPlatformMonitor monitor;
        int x, y;
        glfwGetMonitorPos(glfw_monitors[n], &x, &y);
        const GLFWvidmode* vid_mode = glfwGetVideoMode(glfw_monitors[n]);
#if GLFW_HAS_MONITOR_WORK_AREA
        monitor.MainPos = ImVec2((float)x, (float)y);
        monitor.MainSize = ImVec2((float)vid_mode->width, (float)vid_mode->height);
        int w, h;
        glfwGetMonitorWorkarea(glfw_monitors[n], &x, &y, &w, &h);
        monitor.WorkPos = ImVec2((float)x, (float)y);;
        monitor.WorkSize = ImVec2((float)w, (float)h);
#else
        monitor.MainPos = monitor.WorkPos = ImVec2((float)x, (float)y);
        monitor.MainSize = monitor.WorkSize = ImVec2((float)vid_mode->width, (float)vid_mode->height);
#endif
#if GLFW_HAS_PER_MONITOR_DPI
        // Warning: the validity of monitor DPI information on Windows depends on the application DPI awareness settings, which generally needs to be set in the manifest or at runtime.
        float x_scale, y_scale;
        glfwGetMonitorContentScale(glfw_monitors[n], &x_scale, &y_scale);
        monitor.DpiScale = x_scale;
#endif
        platform_io.Monitors.push_back(monitor);
    }
    g_WantUpdateMonitors = false;
}